

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O2

bool __thiscall QCborStreamWriterPrivate::closeContainer(QCborStreamWriterPrivate *this)

{
  CborEncoder *pCVar1;
  uint8_t *puVar2;
  ptrdiff_t pVar3;
  size_t sVar4;
  anon_union_8_3_8ebc2b8a_for_data aVar5;
  CborError CVar6;
  bool bVar7;
  char *msg;
  anon_union_8_3_8ebc2b8a_for_data *this_00;
  long in_FS_OFFSET;
  undefined1 local_68 [12];
  undefined8 uStack_5c;
  undefined4 local_54;
  char *local_50;
  anon_union_8_3_8ebc2b8a_for_data local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  char *pcStack_30;
  long local_20;
  
  this_00 = (anon_union_8_3_8ebc2b8a_for_data *)local_68;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->containerStack).super_QList<CborEncoder>.d.size == 0) {
    this_00 = &local_48;
    local_48.bytes_needed._0_4_ = 2;
    uStack_34 = 0;
    local_48.bytes_needed._4_4_ = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_38 = 0;
    pcStack_30 = "default";
    msg = "QCborStreamWriter: closing map or array that wasn\'t open";
  }
  else {
    local_38 = 0xaaaaaaaa;
    uStack_34 = 0xaaaaaaaa;
    pcStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.bytes_needed._0_4_ = 0xaaaaaaaa;
    local_48.bytes_needed._4_4_ = 0xaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    QList<CborEncoder>::takeLast
              ((value_type *)&local_48,&(this->containerStack).super_QList<CborEncoder>);
    pCVar1 = &this->encoder;
    puVar2 = (this->encoder).end;
    uStack_40 = SUB84(puVar2,0);
    uStack_3c = (undefined4)((ulong)puVar2 >> 0x20);
    pVar3 = (this->encoder).data.bytes_needed;
    local_48.bytes_needed._0_4_ = (undefined4)pVar3;
    local_48.bytes_needed._4_4_ = (undefined4)((ulong)pVar3 >> 0x20);
    if (((this->encoder).flags & 0x10) == 0) {
      sVar4 = (this->encoder).remaining;
      if (sVar4 == 1) {
        if (puVar2 != (uint8_t *)0x0) {
          (this->encoder).remaining = CONCAT44(uStack_34,local_38);
          *(char **)&(this->encoder).flags = pcStack_30;
          (pCVar1->data).bytes_needed = pVar3;
          (this->encoder).end = puVar2;
          bVar7 = true;
          goto LAB_0043fd61;
        }
        CVar6 = CborErrorOutOfMemory;
      }
      else {
        CVar6 = CborErrorTooFewItems - (uint)(sVar4 == 0);
      }
      (this->encoder).remaining = CONCAT44(uStack_34,local_38);
      *(char **)&(this->encoder).flags = pcStack_30;
      (pCVar1->data).bytes_needed = pVar3;
      (this->encoder).end = puVar2;
    }
    else {
      CVar6 = append_byte_to_buffer((CborEncoder *)&local_48,0xff);
      aVar5.bytes_needed._4_4_ = local_48.bytes_needed._4_4_;
      aVar5.bytes_needed._0_4_ = local_48.bytes_needed._0_4_;
      pCVar1->data = aVar5;
      (this->encoder).end = (uint8_t *)CONCAT44(uStack_3c,uStack_40);
      (this->encoder).remaining = CONCAT44(uStack_34,local_38);
      *(char **)&(this->encoder).flags = pcStack_30;
      bVar7 = true;
      if (CVar6 == CborNoError) goto LAB_0043fd61;
    }
    if (CVar6 == CborErrorTooManyItems) {
      local_68._0_4_ = 2;
      local_54 = 0;
      local_68._4_8_ = 0;
      uStack_5c = 0;
      local_50 = "default";
      msg = "QCborStreamWriter: too many items added to array or map";
    }
    else {
      if (CVar6 != CborErrorTooFewItems) {
        bVar7 = false;
        goto LAB_0043fd61;
      }
      local_68._0_4_ = 2;
      local_54 = 0;
      local_68._4_8_ = 0;
      uStack_5c = 0;
      local_50 = "default";
      msg = "QCborStreamWriter: not enough items added to array or map";
      this_00 = (anon_union_8_3_8ebc2b8a_for_data *)local_68;
    }
  }
  bVar7 = false;
  QMessageLogger::warning((QMessageLogger *)this_00,msg);
LAB_0043fd61:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool closeContainer()
    {
        if (containerStack.isEmpty()) {
            qWarning("QCborStreamWriter: closing map or array that wasn't open");
            return false;
        }

        CborEncoder container = containerStack.pop();
        CborError err = cbor_encoder_close_container(&container, &encoder);
        encoder = container;

        if (Q_UNLIKELY(err)) {
            if (err == CborErrorTooFewItems)
                qWarning("QCborStreamWriter: not enough items added to array or map");
            else if (err == CborErrorTooManyItems)
                qWarning("QCborStreamWriter: too many items added to array or map");
            return false;
        }

        return true;
    }